

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::equivalent(path *p1,path *p2)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_50;
  byte local_29;
  undefined1 auStack_28 [7];
  bool result;
  error_code ec;
  path *p2_local;
  path *p1_local;
  
  ec._M_cat = (error_category *)p2;
  std::error_code::error_code((error_code *)auStack_28);
  local_29 = equivalent(p1,(path *)ec._M_cat,(error_code *)auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return (bool)(local_29 & 1);
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._0_8_ = _auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_50,p1,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool equivalent(const path& p1, const path& p2)
{
    std::error_code ec;
    bool result = equivalent(p1, p2, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p1, p2, ec);
    }
    return result;
}